

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Str_t * Gia_AigerWriteMappingSimple(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *__dest;
  Vec_Str_t *pVVar3;
  size_t __size;
  
  pVVar2 = p->vMapping;
  iVar1 = pVVar2->nSize;
  __size = (long)iVar1 << 2;
  __dest = (char *)malloc(__size);
  memcpy(__dest,pVVar2->pArray,__size);
  if (p->nObjs <= iVar1) {
    pVVar3 = (Vec_Str_t *)malloc(0x10);
    pVVar3->nSize = (int)__size;
    pVVar3->nCap = (int)__size;
    pVVar3->pArray = __dest;
    return pVVar3;
  }
  __assert_fail("Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                ,0xe6,"Vec_Str_t *Gia_AigerWriteMappingSimple(Gia_Man_t *)");
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(p->vMapping) );
    memcpy( pBuffer, Vec_IntArray(p->vMapping), (size_t)4*Vec_IntSize(p->vMapping) );
    assert( Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p) );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(p->vMapping) );
}